

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O2

void __thiscall
xmrig::WorkerJob<2UL>::nextRound(WorkerJob<2UL> *this,uint32_t rounds,uint32_t roundSize)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  long lVar7;
  size_t i;
  bool bVar8;
  
  bVar1 = this->m_index;
  uVar5 = (ulong)bVar1;
  uVar3 = this->m_rounds[uVar5] + 1;
  this->m_rounds[uVar5] = uVar3;
  if (uVar3 % rounds == 0) {
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      uVar4 = Nonce::next((uint8_t)uVar5,
                          *(uint32_t *)
                           (this->m_blobs[0] +
                           this->m_jobs[uVar5].m_size * lVar7 + 0x27 +
                           (ulong)(uint)((int)uVar5 << 8)),roundSize * rounds);
      uVar5 = (ulong)this->m_index;
      *(uint32_t *)(this->m_blobs[this->m_index] + this->m_jobs[uVar5].m_size * lVar7 + 0x27) =
           uVar4;
    }
  }
  else {
    sVar2 = this->m_jobs[uVar5].m_size;
    puVar6 = this->m_blobs[bVar1] + 0x27;
    lVar7 = 2;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      *(uint32_t *)puVar6 = *(int *)puVar6 + roundSize;
      puVar6 = puVar6 + sVar2;
    }
  }
  return;
}

Assistant:

inline void nextRound(uint32_t rounds, uint32_t roundSize)
    {
        m_rounds[index()]++;

        if ((m_rounds[index()] % rounds) == 0) {
            for (size_t i = 0; i < N; ++i) {
                *nonce(i) = Nonce::next(index(), *nonce(i), rounds * roundSize);
            }
        }
        else {
            for (size_t i = 0; i < N; ++i) {
                *nonce(i) += roundSize;
            }
        }
    }